

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client_sample.c
# Opt level: O0

void mqtt_client_sample_run(void)

{
  int iVar1;
  MQTT_CLIENT_HANDLE handle;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE xioHandle;
  XIO_HANDLE xio;
  SOCKETIO_CONFIG config;
  MQTT_CLIENT_OPTIONS options;
  MQTT_CLIENT_HANDLE mqttHandle;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    handle = mqtt_client_init(OnRecvCallback,OnOperationComplete,(void *)0x0,OnErrorComplete,
                              (void *)0x0);
    if (handle == (MQTT_CLIENT_HANDLE)0x0) {
      printf("mqtt_client_init failed\r\n");
    }
    else {
      mqtt_client_set_trace(handle,false,false);
      memset(&config.accepted_socket,0,0x38);
      config.accepted_socket = anon_var_dwarf_57;
      xio = (XIO_HANDLE)anon_var_dwarf_6d;
      config.hostname = (char *)0x75b;
      config.port = 0;
      config._12_4_ = 0;
      io_interface_description = socketio_get_interface_description();
      xioHandle = xio_create(io_interface_description,&xio);
      if (xioHandle == (XIO_HANDLE)0x0) {
        printf("xio_create failed\r\n");
      }
      else {
        iVar1 = mqtt_client_connect(handle,xioHandle,(MQTT_CLIENT_OPTIONS *)&config.accepted_socket)
        ;
        if (iVar1 == 0) {
          do {
            mqtt_client_dowork(handle);
          } while ((g_continue & 1U) != 0);
        }
        else {
          printf("mqtt_client_connect failed\r\n");
        }
        xio_close(xioHandle,OnCloseComplete,(void *)0x0);
        do {
          mqtt_client_dowork(handle);
        } while ((g_close_complete & 1U) != 0);
        xio_destroy(xioHandle);
      }
      mqtt_client_deinit(handle);
    }
    platform_deinit();
  }
  else {
    printf("platform_init failed\r\n");
  }
  return;
}

Assistant:

void mqtt_client_sample_run()
{
    if (platform_init() != 0)
    {
        (void)printf("platform_init failed\r\n");
    }
    else
    {
        MQTT_CLIENT_HANDLE mqttHandle = mqtt_client_init(OnRecvCallback, OnOperationComplete, NULL, OnErrorComplete, NULL);
        if (mqttHandle == NULL)
        {
            (void)printf("mqtt_client_init failed\r\n");
        }
        else
        {
            mqtt_client_set_trace(mqttHandle, false, false);

            MQTT_CLIENT_OPTIONS options = { 0 };
            options.clientId = "azureiotclient";
            options.willMessage = NULL;
            options.username = NULL;
            options.password = NULL;
            options.keepAliveInterval = 10;
            options.useCleanSession = true;
            options.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;

            SOCKETIO_CONFIG config = {"test.mosquitto.org", PORT_NUM_UNENCRYPTED, NULL};

            XIO_HANDLE xio = xio_create(socketio_get_interface_description(), &config);
            if (xio == NULL)
            {
                (void)printf("xio_create failed\r\n");
            }
            else
            {
                if (mqtt_client_connect(mqttHandle, xio, &options) != 0)
                {
                    (void)printf("mqtt_client_connect failed\r\n");
                }
                else
                {
                    do
                    {
                        mqtt_client_dowork(mqttHandle);
                    } while (g_continue);
                }
                xio_close(xio, OnCloseComplete, NULL);

                // Wait for the close connection gets called
                do
                {
                    mqtt_client_dowork(mqttHandle);
                } while (g_close_complete);
                xio_destroy(xio);
            }
            mqtt_client_deinit(mqttHandle);
        }
        platform_deinit();
    }
}